

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyBlobNullAppend(SyBlob *pBlob)

{
  sxu32 sVar1;
  sxi32 sVar2;
  
  sVar1 = pBlob->nByte;
  sVar2 = SyBlobAppend(pBlob,"",1);
  if (sVar2 == 0) {
    pBlob->nByte = sVar1;
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobNullAppend(SyBlob *pBlob)
{
	sxi32 rc;
	sxu32 n;
	n = pBlob->nByte;
	rc = SyBlobAppend(&(*pBlob), (const void *)"\0", sizeof(char));
	if (rc == SXRET_OK ){
		pBlob->nByte = n;
	}
	return rc;
}